

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

void strpool_defrag(strpool_t *pool)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  strpool_internal_hash_slot_t *__s;
  char *pcVar8;
  strpool_internal_entry_t *psVar9;
  strpool_internal_block_t *psVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  char *__dest;
  strpool_internal_entry_t *psVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  strpool_internal_entry_t *psVar22;
  
  if ((long)pool->entry_count < 1) {
    uVar20 = 0;
    iVar6 = 0;
  }
  else {
    lVar14 = 0;
    iVar6 = 0;
    uVar20 = 0;
    do {
      if (0 < *(int *)((long)&pool->entries->refcount + lVar14)) {
        iVar6 = iVar6 + *(int *)((long)&pool->entries->size + lVar14);
        uVar20 = (ulong)((int)uVar20 + 1);
      }
      lVar14 = lVar14 + 0x20;
    } while ((long)pool->entry_count * 0x20 != lVar14);
  }
  iVar21 = pool->block_size;
  if (iVar21 <= iVar6) {
    uVar11 = iVar6 - 1U >> 1 | iVar6 - 1U;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    uVar11 = uVar11 >> 0x10 | uVar11;
    iVar21 = uVar11 + 1 + (uint)(uVar11 == 0xffffffff);
  }
  iVar18 = (int)uVar20;
  iVar7 = ((int)(uVar20 >> 0x1f) + iVar18 >> 1) + iVar18;
  iVar6 = pool->initial_entry_capacity * 2;
  if (iVar6 <= iVar7) {
    uVar11 = iVar7 - 1;
    uVar11 = uVar11 >> 1 | uVar11;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    uVar11 = uVar11 >> 0x10 | uVar11;
    iVar6 = uVar11 + 1 + (uint)(uVar11 == 0xffffffff);
  }
  __s = (strpool_internal_hash_slot_t *)
        (**pool->memctx)(0,(long)iVar6 * 0xc,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (__s == (strpool_internal_hash_slot_t *)0x0) {
    __assert_fail("hash_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x29e,"void strpool_defrag(strpool_t *)");
  }
  memset(__s,0,(long)iVar6 * 0xc);
  pcVar8 = (char *)(**pool->memctx)(0,(long)iVar21,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (pcVar8 == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x2a2,"void strpool_defrag(strpool_t *)");
  }
  iVar7 = pool->initial_entry_capacity;
  if (iVar7 <= iVar18) {
    uVar11 = iVar18 - 1U >> 1 | iVar18 - 1U;
    uVar11 = uVar11 >> 2 | uVar11;
    uVar11 = uVar11 >> 4 | uVar11;
    uVar11 = uVar11 >> 8 | uVar11;
    uVar11 = uVar11 >> 0x10 | uVar11;
    iVar7 = uVar11 + 1 + (uint)(uVar11 == 0xffffffff);
  }
  psVar9 = (strpool_internal_entry_t *)
           (**pool->memctx)(0,(long)iVar7 << 5,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
  if (psVar9 != (strpool_internal_entry_t *)0x0) {
    iVar13 = pool->entry_count;
    __dest = pcVar8;
    if (0 < iVar13) {
      lVar14 = 0;
      iVar19 = 0;
      do {
        if (0 < pool->entries[lVar14].refcount) {
          psVar22 = pool->entries + lVar14;
          iVar4 = psVar22->hash_slot;
          iVar5 = psVar22->handle_index;
          pcVar2 = psVar22->data;
          iVar13 = psVar22->length;
          uVar3 = *(undefined8 *)&psVar22->refcount;
          psVar16 = psVar9 + iVar19;
          psVar16->size = psVar22->size;
          psVar16->length = iVar13;
          *(undefined8 *)(&psVar16->size + 2) = uVar3;
          psVar16 = psVar9 + iVar19;
          psVar16->hash_slot = iVar4;
          psVar16->handle_index = iVar5;
          psVar16->data = pcVar2;
          uVar11 = pool->hash_table[psVar22->hash_slot].hash_key;
          uVar12 = uVar11 & iVar6 - 1U;
          lVar15 = (long)(int)uVar12;
          uVar1 = __s[lVar15].hash_key;
          lVar17 = lVar15;
          while (uVar1 != 0) {
            uVar12 = uVar12 + 1 & iVar6 - 1U;
            lVar17 = (long)(int)uVar12;
            uVar1 = __s[lVar17].hash_key;
          }
          if (uVar11 == 0) {
            __assert_fail("hash",
                          "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                          ,0x2b6,"void strpool_defrag(strpool_t *)");
          }
          psVar16 = psVar9 + iVar19;
          __s[lVar17].hash_key = uVar11;
          __s[lVar17].entry_index = iVar19;
          __s[lVar15].base_count = __s[lVar15].base_count + 1;
          psVar16->hash_slot = uVar12;
          psVar16->data = __dest;
          iVar13 = psVar22->handle_index;
          psVar16->handle_index = iVar13;
          pool->handles[iVar13].entry_index = iVar19;
          memcpy(__dest,psVar22->data,(long)psVar22->length + 9);
          __dest = __dest + psVar22->size;
          iVar19 = iVar19 + 1;
          iVar13 = pool->entry_count;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar13);
    }
    (**pool->memctx)(pool->hash_table,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    if (0 < pool->block_count) {
      lVar17 = 8;
      lVar14 = 0;
      do {
        (**pool->memctx)(*(undefined8 *)((long)&pool->blocks->capacity + lVar17),0,0,0,0,0,
                         *(undefined8 *)((long)pool->memctx + 8));
        lVar14 = lVar14 + 1;
        lVar17 = lVar17 + 0x20;
      } while (lVar14 < pool->block_count);
    }
    iVar13 = pool->block_capacity;
    if (iVar13 == pool->initial_block_capacity) {
      psVar10 = pool->blocks;
    }
    else {
      (**pool->memctx)(pool->blocks,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      psVar10 = (strpool_internal_block_t *)
                (**pool->memctx)(0,(long)pool->initial_block_capacity << 5,0,0,0,0,
                                 *(undefined8 *)((long)pool->memctx + 8));
      pool->blocks = psVar10;
      if (psVar10 == (strpool_internal_block_t *)0x0) {
        __assert_fail("pool->blocks",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x2cf,"void strpool_defrag(strpool_t *)");
      }
      iVar13 = pool->initial_block_capacity;
    }
    pool->block_capacity = iVar13;
    pool->block_count = 1;
    pool->current_block = 0;
    psVar10->capacity = iVar21;
    psVar10->data = pcVar8;
    psVar10->tail = __dest;
    psVar10->free_list = -1;
    pool->hash_table = __s;
    pool->hash_capacity = iVar6;
    pool->entries = psVar9;
    pool->entry_capacity = iVar7;
    pool->entry_count = iVar18;
    return;
  }
  __assert_fail("entries",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x2a7,"void strpool_defrag(strpool_t *)");
}

Assistant:

void strpool_defrag( strpool_t* pool )
    {
    int data_size = 0;
    int count = 0;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            data_size += entry->size;
            ++count;
            }
        }

    int data_capacity = data_size < pool->block_size ? 
        pool->block_size : (int)strpool_internal_pow2ceil( (STRPOOL_U32)data_size );

    int hash_capacity = count + count / 2;
    hash_capacity = hash_capacity < ( pool->initial_entry_capacity * 2 ) ? 
        ( pool->initial_entry_capacity * 2 ) : (int)strpool_internal_pow2ceil( (STRPOOL_U32)hash_capacity );
    strpool_internal_hash_slot_t* hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        hash_capacity * sizeof( *hash_table ) );
    STRPOOL_ASSERT( hash_table );
    STRPOOL_MEMSET( hash_table, 0, hash_capacity * sizeof( *hash_table ) );

    char* data = (char*) STRPOOL_MALLOC( pool->memctx, (size_t) data_capacity );
    STRPOOL_ASSERT( data );
    int capacity = count < pool->initial_entry_capacity ? 
        pool->initial_entry_capacity : (int)strpool_internal_pow2ceil( (STRPOOL_U32)count );
    strpool_internal_entry_t* entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        capacity * sizeof( *entries ) );
    STRPOOL_ASSERT( entries );
    int index = 0;
    char* tail = data;
    for( int i = 0; i < pool->entry_count; ++i )
        {
        strpool_internal_entry_t* entry = &pool->entries[ i ];
        if( entry->refcount > 0 )
            {
            entries[ index ] = *entry;

            STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
            int base_slot = (int)( hash & (STRPOOL_U32)( hash_capacity - 1 ) );
            int slot = base_slot;
            while( hash_table[ slot ].hash_key )
                slot = (slot + 1 ) & ( hash_capacity - 1 );
            STRPOOL_ASSERT( hash );
            hash_table[ slot ].hash_key = hash;
            hash_table[ slot ].entry_index = index;
            ++hash_table[ base_slot ].base_count;

            entries[ index ].hash_slot = slot;
            entries[ index ].data = tail;
            entries[ index ].handle_index = entry->handle_index;
            pool->handles[ entry->handle_index ].entry_index = index;
            STRPOOL_MEMCPY( tail, entry->data, entry->length + 1 + 2 * sizeof( STRPOOL_U32 ) );
            tail += entry->size;
            ++index;
            }
        }


    STRPOOL_FREE( pool->memctx, pool->hash_table );
    STRPOOL_FREE( pool->memctx, pool->entries );
    for( int i = 0; i < pool->block_count; ++i ) STRPOOL_FREE( pool->memctx, pool->blocks[ i ].data );

    if( pool->block_capacity != pool->initial_block_capacity )
        {
        STRPOOL_FREE( pool->memctx, pool->blocks );
        pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
            pool->initial_block_capacity * sizeof( *pool->blocks ) );
        STRPOOL_ASSERT( pool->blocks );
        }
    pool->block_capacity = pool->initial_block_capacity;
    pool->block_count = 1;
    pool->current_block = 0;
    pool->blocks[ 0 ].capacity = data_capacity;
    pool->blocks[ 0 ].data = data;
    pool->blocks[ 0 ].tail = tail;
    pool->blocks[ 0 ].free_list = -1;
    
    pool->hash_table = hash_table;
    pool->hash_capacity = hash_capacity;

    pool->entries = entries;
    pool->entry_capacity = capacity;
    pool->entry_count = count;
    }